

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompositeDeepScanLine.cpp
# Opt level: O0

void testCompositeDeepScanLine(string *tempDir)

{
  ostream *poVar1;
  ulong uVar2;
  int pass;
  int passes;
  string *in_stack_00000270;
  undefined1 in_stack_0000027e;
  undefined1 in_stack_0000027f;
  int in_stack_00000280;
  int in_stack_00000284;
  int local_10;
  int local_c;
  
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "\n\nTesting deep compositing interface basic functionality:\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_c = 2;
  uVar2 = IlmThread_3_2::supportsThreads();
  if ((uVar2 & 1) == 0) {
    local_c = 1;
  }
  random_reseed(0);
  for (local_10 = 0; local_10 < 2; local_10 = local_10 + 1) {
    anon_unknown.dwarf_604d5::test_parts<float>
              (in_stack_00000284,in_stack_00000280,(bool)in_stack_0000027f,(bool)in_stack_0000027e,
               in_stack_00000270);
    anon_unknown.dwarf_604d5::test_parts<float>
              (in_stack_00000284,in_stack_00000280,(bool)in_stack_0000027f,(bool)in_stack_0000027e,
               in_stack_00000270);
    anon_unknown.dwarf_604d5::test_parts<Imath_3_2::half>
              (in_stack_00000284,in_stack_00000280,(bool)in_stack_0000027f,(bool)in_stack_0000027e,
               in_stack_00000270);
    anon_unknown.dwarf_604d5::test_parts<Imath_3_2::half>
              (in_stack_00000284,in_stack_00000280,(bool)in_stack_0000027f,(bool)in_stack_0000027e,
               in_stack_00000270);
    anon_unknown.dwarf_604d5::test_parts<float>
              (in_stack_00000284,in_stack_00000280,(bool)in_stack_0000027f,(bool)in_stack_0000027e,
               in_stack_00000270);
    anon_unknown.dwarf_604d5::test_parts<float>
              (in_stack_00000284,in_stack_00000280,(bool)in_stack_0000027f,(bool)in_stack_0000027e,
               in_stack_00000270);
    anon_unknown.dwarf_604d5::test_parts<Imath_3_2::half>
              (in_stack_00000284,in_stack_00000280,(bool)in_stack_0000027f,(bool)in_stack_0000027e,
               in_stack_00000270);
    anon_unknown.dwarf_604d5::test_parts<Imath_3_2::half>
              (in_stack_00000284,in_stack_00000280,(bool)in_stack_0000027f,(bool)in_stack_0000027e,
               in_stack_00000270);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "Testing deep compositing across multiple parts:\n");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    anon_unknown.dwarf_604d5::test_parts<float>
              (in_stack_00000284,in_stack_00000280,(bool)in_stack_0000027f,(bool)in_stack_0000027e,
               in_stack_00000270);
    anon_unknown.dwarf_604d5::test_parts<float>
              (in_stack_00000284,in_stack_00000280,(bool)in_stack_0000027f,(bool)in_stack_0000027e,
               in_stack_00000270);
    anon_unknown.dwarf_604d5::test_parts<Imath_3_2::half>
              (in_stack_00000284,in_stack_00000280,(bool)in_stack_0000027f,(bool)in_stack_0000027e,
               in_stack_00000270);
    anon_unknown.dwarf_604d5::test_parts<Imath_3_2::half>
              (in_stack_00000284,in_stack_00000280,(bool)in_stack_0000027f,(bool)in_stack_0000027e,
               in_stack_00000270);
    anon_unknown.dwarf_604d5::test_parts<float>
              (in_stack_00000284,in_stack_00000280,(bool)in_stack_0000027f,(bool)in_stack_0000027e,
               in_stack_00000270);
    anon_unknown.dwarf_604d5::test_parts<float>
              (in_stack_00000284,in_stack_00000280,(bool)in_stack_0000027f,(bool)in_stack_0000027e,
               in_stack_00000270);
    anon_unknown.dwarf_604d5::test_parts<Imath_3_2::half>
              (in_stack_00000284,in_stack_00000280,(bool)in_stack_0000027f,(bool)in_stack_0000027e,
               in_stack_00000270);
    anon_unknown.dwarf_604d5::test_parts<Imath_3_2::half>
              (in_stack_00000284,in_stack_00000280,(bool)in_stack_0000027f,(bool)in_stack_0000027e,
               in_stack_00000270);
    anon_unknown.dwarf_604d5::test_parts<float>
              (in_stack_00000284,in_stack_00000280,(bool)in_stack_0000027f,(bool)in_stack_0000027e,
               in_stack_00000270);
    anon_unknown.dwarf_604d5::test_parts<float>
              (in_stack_00000284,in_stack_00000280,(bool)in_stack_0000027f,(bool)in_stack_0000027e,
               in_stack_00000270);
    anon_unknown.dwarf_604d5::test_parts<Imath_3_2::half>
              (in_stack_00000284,in_stack_00000280,(bool)in_stack_0000027f,(bool)in_stack_0000027e,
               in_stack_00000270);
    anon_unknown.dwarf_604d5::test_parts<Imath_3_2::half>
              (in_stack_00000284,in_stack_00000280,(bool)in_stack_0000027f,(bool)in_stack_0000027e,
               in_stack_00000270);
    if ((local_c == 2) && (local_10 == 0)) {
      std::operator<<((ostream *)&std::cout," testing with multithreading...\n");
      Imf_3_2::setGlobalThreadCount(0x40);
    }
  }
  poVar1 = std::operator<<((ostream *)&std::cout," ok\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
testCompositeDeepScanLine (const std::string& tempDir)
{

    cout << "\n\nTesting deep compositing interface basic functionality:\n"
         << endl;

    int passes = 2;
    if (!ILMTHREAD_NAMESPACE::supportsThreads ()) { passes = 1; }

    random_reseed (1);

    for (int pass = 0; pass < 2; pass++)
    {

        test_parts<float> (0, 1, true, true, tempDir);
        test_parts<float> (0, 1, false, false, tempDir);
        test_parts<half> (0, 1, true, false, tempDir);
        test_parts<half> (0, 1, false, true, tempDir);

        //
        // test pattern 1: tested by confirming data is written correctly and
        // then reading correct results in Nuke
        //
        test_parts<float> (1, 1, true, false, tempDir);
        test_parts<float> (1, 1, false, true, tempDir);
        test_parts<half> (1, 1, true, true, tempDir);
        test_parts<half> (1, 1, false, false, tempDir);

        cout << "Testing deep compositing across multiple parts:\n" << endl;

        test_parts<float> (0, 5, true, false, tempDir);
        test_parts<float> (0, 5, false, true, tempDir);
        test_parts<half> (0, 5, true, false, tempDir);
        test_parts<half> (0, 5, false, true, tempDir);

        test_parts<float> (1, 3, true, true, tempDir);
        test_parts<float> (1, 3, false, false, tempDir);
        test_parts<half> (1, 3, true, true, tempDir);
        test_parts<half> (1, 3, false, false, tempDir);

        test_parts<float> (1, 4, true, true, tempDir);
        test_parts<float> (1, 4, false, false, tempDir);
        test_parts<half> (1, 4, true, false, tempDir);
        test_parts<half> (1, 4, false, true, tempDir);

        if (passes == 2 && pass == 0)
        {
            cout << " testing with multithreading...\n";
            setGlobalThreadCount (64);
        }
    }
    cout << " ok\n" << endl;
}